

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

bool __thiscall rcg::Buffer::getImagePresent(Buffer *this,uint32_t part)

{
  bool bVar1;
  unsigned_long uVar2;
  undefined4 in_ESI;
  shared_ptr<const_rcg::GenTLWrapper> *in_RDI;
  bool ret;
  size_t type;
  undefined8 in_stack_ffffffffffffffc8;
  BUFFER_PART_INFO_CMD in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  bool local_1;
  
  if (((ulong)in_RDI[2].super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi & 1) == 0) {
    if ((in_RDI[2].super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x4) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 3)), bVar1)) {
      local_1 = true;
    }
    else {
      Stream::getHandle((Stream *)
                        (in_RDI->
                        super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
      local_1 = anon_unknown_5::getBufferBool
                          (in_stack_ffffffffffffffe0,
                           (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                           in_RDI,(BUFFER_INFO_CMD)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    }
  }
  else {
    Stream::getHandle((Stream *)
                      (in_RDI->
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
    uVar2 = anon_unknown_5::getBufferPartValue<unsigned_long>
                      (in_RDI,(void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                      );
    local_1 = uVar2 - 1 < 9;
  }
  return local_1;
}

Assistant:

bool Buffer::getImagePresent(uint32_t part) const
{
  if (multipart)
  {
    size_t type=getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                           GenTL::BUFFER_PART_INFO_DATA_TYPE);

    bool ret;

    switch (type)
    {
      case PART_DATATYPE_2D_IMAGE:
      case PART_DATATYPE_2D_PLANE_BIPLANAR:
      case PART_DATATYPE_2D_PLANE_TRIPLANAR:
      case PART_DATATYPE_2D_PLANE_QUADPLANAR:
      case PART_DATATYPE_3D_IMAGE:
      case PART_DATATYPE_3D_PLANE_BIPLANAR:
      case PART_DATATYPE_3D_PLANE_TRIPLANAR:
      case PART_DATATYPE_3D_PLANE_QUADPLANAR:
      case PART_DATATYPE_CONFIDENCE_MAP:
        ret=true;
        break;

      default:
        ret=false;
        break;
    }

    return ret;
  }
  else
  {
    if (payload_type == PAYLOAD_TYPE_CHUNK_DATA && nodemap)
    {
      return true;
    }

    return getBufferBool(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_IMAGEPRESENT);
  }
}